

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

shared_ptr<Buffer> __thiscall
qpdf::Stream::getStreamData(Stream *this,qpdf_stream_decode_level_e decode_level)

{
  qpdf_offset_t offset;
  QPDFExc *this_00;
  qpdf_stream_decode_level_e in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Stream *this_01;
  shared_ptr<Buffer> sVar1;
  bool filtered;
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  Pl_Buffer buf;
  
  this_01 = (Stream *)CONCAT44(in_register_00000034,decode_level);
  Pl_Buffer::Pl_Buffer(&buf,"stream data buffer",(Pipeline *)0x0);
  pipeStreamData(this_01,&buf.super_Pipeline,&filtered,0,in_EDX,false,false);
  if (filtered != false) {
    Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)this);
    Pl_Buffer::~Pl_Buffer(&buf);
    sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Buffer>)sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  QPDF::getFilename_abi_cxx11_
            (&local_78,
             ((this_01->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_b9);
  offset = ((this_01->super_BaseHandle).obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parsed_offset;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"getStreamData called on unfilterable stream",&local_ba);
  QPDFExc::QPDFExc(this_00,qpdf_e_unsupported,&local_78,&local_98,offset,&local_b8);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

std::shared_ptr<Buffer>
Stream::getStreamData(qpdf_stream_decode_level_e decode_level)
{
    Pl_Buffer buf("stream data buffer");
    bool filtered;
    pipeStreamData(&buf, &filtered, 0, decode_level, false, false);
    if (!filtered) {
        throw QPDFExc(
            qpdf_e_unsupported,
            obj->getQPDF()->getFilename(),
            "",
            obj->getParsedOffset(),
            "getStreamData called on unfilterable stream");
    }
    QTC::TC("qpdf", "QPDF_Stream getStreamData");
    return buf.getBufferSharedPointer();
}